

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

DolbyAtmosSubDescriptor * __thiscall
ASDCP::MXF::DolbyAtmosSubDescriptor::InitFromTLVSet(DolbyAtmosSubDescriptor *this,TLVReader *TLVSet)

{
  MDDEntry *pMVar1;
  MDDEntry *in_RDX;
  TLVReader local_80;
  
  if (TLVSet[1].super_MemIOReader.m_p != (byte_t *)0x0) {
    InterchangeObject::InitFromTLVSet(&this->super_InterchangeObject,TLVSet);
    if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_DolbyAtmosSubDescriptor_AtmosID);
      TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
        pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                  MDD_DolbyAtmosSubDescriptor_FirstFrame);
        TLVReader::ReadUi32(&local_80,in_RDX,(ui32_t *)pMVar1);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
        Kumu::Result_t::~Result_t((Result_t *)&local_80);
        if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
          pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                    MDD_DolbyAtmosSubDescriptor_MaxChannelCount);
          TLVReader::ReadUi16(&local_80,in_RDX,(ui16_t *)pMVar1);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
          Kumu::Result_t::~Result_t((Result_t *)&local_80);
          if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
            pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                      MDD_DolbyAtmosSubDescriptor_MaxObjectCount);
            TLVReader::ReadUi16(&local_80,in_RDX,(ui16_t *)pMVar1);
            Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
            Kumu::Result_t::~Result_t((Result_t *)&local_80);
            if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
              pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                        MDD_DolbyAtmosSubDescriptor_AtmosVersion);
              TLVReader::ReadUi8(&local_80,in_RDX,pMVar1->ul);
              Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
              Kumu::Result_t::~Result_t((Result_t *)&local_80);
            }
          }
        }
      }
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x10fc,
                "virtual ASDCP::Result_t ASDCP::MXF::DolbyAtmosSubDescriptor::InitFromTLVSet(TLVReader &)"
               );
}

Assistant:

ASDCP::Result_t
DolbyAtmosSubDescriptor::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = InterchangeObject::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(DolbyAtmosSubDescriptor, AtmosID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(DolbyAtmosSubDescriptor, FirstFrame));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi16(OBJ_READ_ARGS(DolbyAtmosSubDescriptor, MaxChannelCount));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi16(OBJ_READ_ARGS(DolbyAtmosSubDescriptor, MaxObjectCount));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi8(OBJ_READ_ARGS(DolbyAtmosSubDescriptor, AtmosVersion));
  return result;
}